

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_cyclicrefresh.c
# Opt level: O0

void cyclic_refresh_update_map(AV1_COMP *cpi)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int mi_stride_00;
  int iVar12;
  long in_RDI;
  bool bVar13;
  int bl_index2;
  int scale_low;
  int scale;
  int mi_col;
  int mi_row;
  int sb_col_index;
  int sb_row_index;
  int sum_map;
  int mi_stride;
  int mi_cols;
  int mi_rows;
  uint64_t thresh_sad;
  uint64_t thresh_sad_low;
  uint64_t sb_sad;
  int y;
  int x;
  int ymis;
  int xmis;
  int sbs_in_frame;
  int sb_cols;
  int sb_rows;
  int bl_index;
  int block_count;
  int i;
  uchar *active_map_4x4;
  uchar *seg_map;
  CYCLIC_REFRESH *cr;
  CommonModeInfoParams *mi_params;
  AV1_COMMON *cm;
  int in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int local_80;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  int local_58;
  int local_54;
  int local_34;
  
  piVar4 = *(int **)(in_RDI + 0x712a8);
  lVar5 = *(long *)(in_RDI + 0x712b8);
  local_60 = 0;
  local_68 = 0;
  local_70 = 0x7fffffffffffffff;
  iVar1 = *(int *)(in_RDI + 0x3c194);
  iVar2 = *(int *)(in_RDI + 0x3c198);
  if (*(int *)(in_RDI + 0x712b0) == 0) {
    memset(*(void **)(in_RDI + 0x71298),0,(long)(iVar1 * iVar2));
  }
  iVar6 = (iVar2 + *(int *)(*(long *)(in_RDI + 0x42008) + 0x20) + -1) /
          *(int *)(*(long *)(in_RDI + 0x42008) + 0x20);
  iVar7 = iVar6 * ((iVar1 + *(int *)(*(long *)(in_RDI + 0x42008) + 0x20) + -1) /
                  *(int *)(*(long *)(in_RDI + 0x42008) + 0x20));
  iVar3 = *piVar4;
  if (iVar7 <= piVar4[3]) {
    piVar4[3] = 0;
  }
  local_34 = piVar4[3];
  piVar4[4] = piVar4[3];
  piVar4[6] = 0;
  do {
    local_80 = 0;
    iVar8 = local_34 / iVar6;
    iVar9 = local_34 - iVar8 * iVar6;
    iVar10 = iVar8 * *(int *)(*(long *)(in_RDI + 0x42008) + 0x20);
    iVar11 = iVar9 * *(int *)(*(long *)(in_RDI + 0x42008) + 0x20);
    if (iVar2 - iVar11 < *(int *)(*(long *)(in_RDI + 0x42008) + 0x20)) {
      mi_stride_00 = iVar2 - iVar11;
    }
    else {
      mi_stride_00 = *(int *)(*(long *)(in_RDI + 0x42008) + 0x20);
    }
    if (iVar1 - iVar10 < *(int *)(*(long *)(in_RDI + 0x42008) + 0x20)) {
      iVar12 = iVar1 - iVar10;
    }
    else {
      iVar12 = *(int *)(*(long *)(in_RDI + 0x42008) + 0x20);
    }
    if ((((piVar4[0x1d] != 0) && (0x1e < *(int *)(in_RDI + 0x607a0))) && (0x1e < piVar4[0x1c])) &&
       ((*(long *)(in_RDI + 0x9d648) != 0 &&
        (*(int *)(in_RDI + 0x9d330) == *(int *)(in_RDI + 0x9d338) + -1)))) {
      local_60 = *(ulong *)(*(long *)(in_RDI + 0x9d648) + (long)(iVar9 + iVar6 * iVar8) * 8);
      in_stack_ffffffffffffff6c = 8;
      if (*(int *)(in_RDI + 0x3bfb8) * *(int *)(in_RDI + 0x3bfbc) < 0x38400) {
        in_stack_ffffffffffffff6c = 6;
      }
      in_stack_ffffffffffffff68 = 2;
      local_70 = (ulong)(in_stack_ffffffffffffff6c << 0xc);
      local_68 = 0x2000;
      if ((1 < *(int *)(in_RDI + 0x9d33c)) && (*(int *)(in_RDI + 0x9d334) == 0)) {
        local_70 = local_70 << 4;
        local_68 = 0x8000;
      }
    }
    for (local_58 = 0; local_58 < iVar12; local_58 = local_58 + 2) {
      for (local_54 = 0; local_54 < mi_stride_00; local_54 = local_54 + 2) {
        in_stack_ffffffffffffff64 = iVar10 * iVar2 + iVar11 + local_58 * iVar2 + local_54;
        if (((*(char *)(*(long *)(piVar4 + 10) + (long)in_stack_ffffffffffffff64) == '\0') ||
            (local_60 < local_68)) &&
           ((*(int *)(in_RDI + 0x712b0) == 0 ||
            (*(char *)(lVar5 + in_stack_ffffffffffffff64) == '\0')))) {
          local_80 = local_80 + 4;
        }
        else if (*(char *)(*(long *)(piVar4 + 10) + (long)in_stack_ffffffffffffff64) < '\0') {
          *(char *)(*(long *)(piVar4 + 10) + (long)in_stack_ffffffffffffff64) =
               *(char *)(*(long *)(piVar4 + 10) + (long)in_stack_ffffffffffffff64) + '\x01';
        }
      }
    }
    if ((mi_stride_00 * iVar12 >> 1 <= local_80) && (local_60 < local_70)) {
      set_segment_id((uint8_t *)CONCAT44(iVar10,iVar11),in_stack_ffffffffffffff6c,
                     in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,mi_stride_00,
                     (uint8_t)((uint)iVar12 >> 0x18));
      piVar4[6] = mi_stride_00 * iVar12 + piVar4[6];
    }
    local_34 = local_34 + 1;
    if (local_34 == iVar7) {
      local_34 = 0;
    }
    bVar13 = false;
    if (piVar4[6] < (iVar3 * iVar1 * iVar2) / 100) {
      bVar13 = local_34 != piVar4[3];
    }
  } while (bVar13);
  piVar4[3] = local_34;
  if ((piVar4[6] == 0) && (*(int *)(in_RDI + 0x712b0) == 0)) {
    av1_disable_segmentation((segmentation *)(in_RDI + 0x409b8));
  }
  return;
}

Assistant:

static void cyclic_refresh_update_map(AV1_COMP *const cpi) {
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
  unsigned char *const seg_map = cpi->enc_seg.map;
  unsigned char *const active_map_4x4 = cpi->active_map.map;
  int i, block_count, bl_index, sb_rows, sb_cols, sbs_in_frame;
  int xmis, ymis, x, y;
  uint64_t sb_sad = 0;
  uint64_t thresh_sad_low = 0;
  uint64_t thresh_sad = INT64_MAX;
  const int mi_rows = mi_params->mi_rows, mi_cols = mi_params->mi_cols;
  const int mi_stride = mi_cols;
  // Don't set seg_map to 0 if active_maps is enabled. Active_maps will set
  // seg_map to either 7 or 0 (AM_SEGMENT_ID_INACTIVE/ACTIVE), and cyclic
  // refresh set below (segment 1 or 2) will only be set for ACTIVE blocks.
  if (!cpi->active_map.enabled) {
    memset(seg_map, CR_SEGMENT_ID_BASE, mi_rows * mi_cols);
  }
  sb_cols = (mi_cols + cm->seq_params->mib_size - 1) / cm->seq_params->mib_size;
  sb_rows = (mi_rows + cm->seq_params->mib_size - 1) / cm->seq_params->mib_size;
  sbs_in_frame = sb_cols * sb_rows;
  // Number of target blocks to get the q delta (segment 1).
  block_count = cr->percent_refresh * mi_rows * mi_cols / 100;
  // Set the segmentation map: cycle through the superblocks, starting at
  // cr->mb_index, and stopping when either block_count blocks have been found
  // to be refreshed, or we have passed through whole frame.
  if (cr->sb_index >= sbs_in_frame) cr->sb_index = 0;
  assert(cr->sb_index < sbs_in_frame);
  i = cr->sb_index;
  cr->last_sb_index = cr->sb_index;
  cr->target_num_seg_blocks = 0;
  do {
    int sum_map = 0;
    // Get the mi_row/mi_col corresponding to superblock index i.
    int sb_row_index = (i / sb_cols);
    int sb_col_index = i - sb_row_index * sb_cols;
    int mi_row = sb_row_index * cm->seq_params->mib_size;
    int mi_col = sb_col_index * cm->seq_params->mib_size;
    assert(mi_row >= 0 && mi_row < mi_rows);
    assert(mi_col >= 0 && mi_col < mi_cols);
    bl_index = mi_row * mi_stride + mi_col;
    // Loop through all MI blocks in superblock and update map.
    xmis = AOMMIN(mi_cols - mi_col, cm->seq_params->mib_size);
    ymis = AOMMIN(mi_rows - mi_row, cm->seq_params->mib_size);
    if (cr->use_block_sad_scene_det && cpi->rc.frames_since_key > 30 &&
        cr->counter_encode_maxq_scene_change > 30 &&
        cpi->src_sad_blk_64x64 != NULL &&
        cpi->svc.spatial_layer_id == cpi->svc.number_spatial_layers - 1) {
      sb_sad = cpi->src_sad_blk_64x64[sb_col_index + sb_cols * sb_row_index];
      int scale = (cm->width * cm->height < 640 * 360) ? 6 : 8;
      int scale_low = 2;
      thresh_sad = (scale * 64 * 64);
      thresh_sad_low = (scale_low * 64 * 64);
      // For temporal layers: the base temporal layer (temporal_layer_id = 0)
      // has larger frame separation (2 or 4 frames apart), so use larger sad
      // thresholds to compensate for larger frame sad. The larger thresholds
      // also increase the amount of refresh, which is needed for the base
      // temporal layer.
      if (cpi->svc.number_temporal_layers > 1 &&
          cpi->svc.temporal_layer_id == 0) {
        thresh_sad <<= 4;
        thresh_sad_low <<= 2;
      }
    }
    // cr_map only needed at 8x8 blocks.
    for (y = 0; y < ymis; y += 2) {
      for (x = 0; x < xmis; x += 2) {
        const int bl_index2 = bl_index + y * mi_stride + x;
        // If the block is as a candidate for clean up then mark it
        // for possible boost/refresh (segment 1). The segment id may get
        // reset to 0 later if block gets coded anything other than low motion.
        // If the block_sad (sb_sad) is very low label it for refresh anyway.
        // If active_maps is enabled, only allow for setting on ACTIVE blocks.
        if ((cr->map[bl_index2] == 0 || sb_sad < thresh_sad_low) &&
            (!cpi->active_map.enabled ||
             active_map_4x4[bl_index2] == AM_SEGMENT_ID_ACTIVE)) {
          sum_map += 4;
        } else if (cr->map[bl_index2] < 0) {
          cr->map[bl_index2]++;
        }
      }
    }
    // Enforce constant segment over superblock.
    // If segment is at least half of superblock, set to 1.
    // Enforce that block sad (sb_sad) is not too high.
    if (sum_map >= (xmis * ymis) >> 1 && sb_sad < thresh_sad) {
      set_segment_id(seg_map, bl_index, xmis, ymis, mi_stride,
                     CR_SEGMENT_ID_BOOST1);
      cr->target_num_seg_blocks += xmis * ymis;
    }
    i++;
    if (i == sbs_in_frame) {
      i = 0;
    }
  } while (cr->target_num_seg_blocks < block_count && i != cr->sb_index);
  cr->sb_index = i;
  if (cr->target_num_seg_blocks == 0) {
    // Disable segmentation, seg_map is already set to 0 above.
    // Don't disable if active_map is being used.
    if (!cpi->active_map.enabled) av1_disable_segmentation(&cm->seg);
  }
}